

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O1

oonf_stream_session_state
dlep_session_process_tcp(oonf_stream_session *tcp_session,dlep_session *session)

{
  size_t sVar1;
  oonf_stream_session_state oVar2;
  ssize_t sVar3;
  
  if (((&log_global_mask)[session->log_source] & 1) != 0) {
    oonf_log(1,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x123,0,0,
             "Process TCP buffer of %zu bytes",(tcp_session->in)._len);
  }
  sVar3 = dlep_session_process_buffer(session,(tcp_session->in)._buf,(tcp_session->in)._len,false);
  oVar2 = STREAM_SESSION_CLEANUP;
  if ((-1 < sVar3) && (session->restrict_signal != DLEP_KILL_SESSION)) {
    if (((&log_global_mask)[session->log_source] & 1) != 0) {
      oonf_log(1,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x130,0,0,
               "Processed %zd bytes",sVar3);
    }
    abuf_pull(&tcp_session->in,sVar3);
    sVar1 = ((session->writer).out)->_len;
    if (sVar1 != 0) {
      if (((&log_global_mask)[session->log_source] & 1) != 0) {
        oonf_log(1,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x136,0,0,
                 "Trigger sending %zu bytes",sVar1);
      }
      oonf_stream_flush(tcp_session);
    }
    oVar2 = (uint)(session->restrict_signal == DLEP_KILL_SESSION) * 2 + STREAM_SESSION_ACTIVE;
  }
  return oVar2;
}

Assistant:

enum oonf_stream_session_state
dlep_session_process_tcp(struct oonf_stream_session *tcp_session, struct dlep_session *session)
{
  ssize_t processed;

  OONF_DEBUG(
    session->log_source, "Process TCP buffer of %" PRINTF_SIZE_T_SPECIFIER " bytes", abuf_getlen(&tcp_session->in));

  processed = dlep_session_process_buffer(session, abuf_getptr(&tcp_session->in), abuf_getlen(&tcp_session->in), false);

  if (processed < 0) {
    /* session is most likely invalid now */
    return STREAM_SESSION_CLEANUP;
  }

  if (session->restrict_signal == DLEP_KILL_SESSION) {
    return STREAM_SESSION_CLEANUP;
  }

  OONF_DEBUG(session->log_source, "Processed %" PRINTF_SSIZE_T_SPECIFIER " bytes", processed);

  abuf_pull(&tcp_session->in, processed);

  if (abuf_getlen(session->writer.out) > 0) {
    OONF_DEBUG(
      session->log_source, "Trigger sending %" PRINTF_SIZE_T_SPECIFIER " bytes", abuf_getlen(session->writer.out));

    /* send answer */
    oonf_stream_flush(tcp_session);
  }

  if (session->restrict_signal == DLEP_KILL_SESSION) {
    return STREAM_SESSION_CLEANUP;
  }
  return STREAM_SESSION_ACTIVE;
}